

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O2

int __thiscall Gudhi::ripser::Union_find<int>::link(Union_find<int> *this,char *__from,char *__to)

{
  pointer piVar1;
  pointer puVar2;
  vertex_t vVar3;
  vertex_t vVar4;
  
  vVar3 = find(this,(vertex_t)__from);
  vVar4 = find(this,(vertex_t)__to);
  if (vVar3 != vVar4) {
    piVar1 = (this->parent).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->rank).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar2[vVar4] < puVar2[vVar3]) {
      piVar1[vVar4] = vVar3;
    }
    else {
      piVar1[vVar3] = vVar4;
      if (puVar2[vVar3] == puVar2[vVar4]) {
        puVar2[vVar4] = puVar2[vVar3] + '\x01';
      }
    }
  }
  return vVar4;
}

Assistant:

void link(vertex_t x, vertex_t y) {
      // this line is redundant, the caller already does it
      if ((x = find(x)) == (y = find(y))) return;
      if (rank[x] > rank[y])
        parent[y] = x;
      else {
        parent[x] = y;
        if (rank[x] == rank[y]) ++rank[y];
      }
    }